

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall ON_PlaneEquation::ZeroTolerance(ON_PlaneEquation *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  ON_3dVector Y;
  ON_3dVector N;
  ON_3dVector X;
  ON_3dPoint P;
  ON_3dVector local_160;
  ON_3dVector local_148;
  ON_3dVector local_130;
  ON_3dPoint local_118;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  ON_3dPoint local_98;
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  ON_3dVector local_50;
  ON_3dPoint local_38;
  
  ON_3dVector::ON_3dVector(&local_130,this->x,this->y,this->z);
  bVar7 = ON_3dVector::Unitize(&local_130);
  dVar2 = 0.0;
  if ((bVar7) && (dVar2 = 0.0, ABS(this->d) < 1.23432101234321e+308)) {
    dVar2 = -this->d;
    ON_3dPoint::ON_3dPoint(&local_38,local_130.x * dVar2,local_130.y * dVar2,dVar2 * local_130.z);
    dVar6 = local_38.z;
    dVar5 = local_38.y;
    dVar4 = local_38.x;
    dVar2 = this->x;
    dVar8 = this->y;
    dVar9 = this->z;
    dVar1 = this->d;
    ON_3dVector::PerpendicularTo(&local_50,&local_130);
    ON_3dVector::Unitize(&local_50);
    ON_3dPoint::ON_3dPoint(&local_118,dVar4 + local_50.x,dVar5 + local_50.y,dVar6 + local_50.z);
    dVar3 = ABS(this->d + local_118.z * this->z + local_118.x * this->x + this->y * local_118.y);
    dVar2 = ABS(dVar1 + dVar6 * dVar9 + dVar4 * dVar2 + dVar5 * dVar8);
    if (dVar3 <= dVar2) {
      dVar3 = dVar2;
    }
    ON_3dPoint::ON_3dPoint
              (&local_68,local_38.x - local_50.x,local_38.y - local_50.y,local_38.z - local_50.z);
    dVar2 = this->d;
    dVar8 = ABS(this->z * local_68.z + this->x * local_68.x + this->y * local_68.y + dVar2);
    if (dVar8 <= dVar3) {
      dVar8 = dVar3;
    }
    ON_3dVector::ON_3dVector(&local_160,local_50.x * dVar2,local_50.y * dVar2,dVar2 * local_50.z);
    ON_3dPoint::ON_3dPoint
              (&local_80,local_38.x + local_160.x,local_38.y + local_160.y,local_38.z + local_160.z)
    ;
    dVar2 = this->d;
    dVar9 = ABS(this->z * local_80.z + this->x * local_80.x + this->y * local_80.y + dVar2);
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    ON_3dVector::ON_3dVector(&local_160,local_50.x * dVar2,local_50.y * dVar2,dVar2 * local_50.z);
    ON_3dPoint::ON_3dPoint
              (&local_98,local_38.x - local_160.x,local_38.y - local_160.y,local_38.z - local_160.z)
    ;
    dVar2 = ABS(this->z * local_98.z + this->x * local_98.x + this->y * local_98.y + this->d);
    if (dVar2 <= dVar9) {
      dVar2 = dVar9;
    }
    ON_3dVector::ON_3dVector
              (&local_160,local_130.y * local_50.z - local_130.z * local_50.y,
               local_130.z * local_50.x - local_50.z * local_130.x,
               local_130.x * local_50.y - local_130.y * local_50.x);
    ON_3dVector::Unitize(&local_160);
    ON_3dPoint::ON_3dPoint
              (&local_b0,local_38.x + local_160.x,local_38.y + local_160.y,local_38.z + local_160.z)
    ;
    dVar8 = ABS(this->z * local_b0.z + this->x * local_b0.x + this->y * local_b0.y + this->d);
    if (dVar8 <= dVar2) {
      dVar8 = dVar2;
    }
    ON_3dPoint::ON_3dPoint
              (&local_c8,local_38.x - local_160.x,local_38.y - local_160.y,local_38.z - local_160.z)
    ;
    dVar2 = this->d;
    dVar9 = ABS(this->z * local_c8.z + this->x * local_c8.x + this->y * local_c8.y + dVar2);
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    ON_3dVector::ON_3dVector(&local_148,local_160.x * dVar2,local_160.y * dVar2,dVar2 * local_160.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_e0,local_38.x + local_148.x,local_38.y + local_148.y,local_38.z + local_148.z)
    ;
    dVar2 = this->d;
    dVar8 = ABS(this->z * local_e0.z + this->x * local_e0.x + this->y * local_e0.y + dVar2);
    if (dVar8 <= dVar9) {
      dVar8 = dVar9;
    }
    ON_3dVector::ON_3dVector(&local_148,local_160.x * dVar2,local_160.y * dVar2,dVar2 * local_160.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_f8,local_38.x - local_148.x,local_38.y - local_148.y,local_38.z - local_148.z)
    ;
    dVar2 = ABS(this->z * local_f8.z + this->x * local_f8.x + this->y * local_f8.y + this->d);
    if (dVar2 <= dVar8) {
      dVar2 = dVar8;
    }
  }
  return dVar2;
}

Assistant:

double ON_PlaneEquation::ZeroTolerance() const
{
  double zero_tolerance = 0.0;
  ON_3dVector N(x,y,z);
  if ( N.Unitize() && ON_IS_VALID(d) )
  {
    const ON_3dPoint P( -d*N.x, -d*N.y, -d*N.z  );

    zero_tolerance = fabs(ValueAt(P));

    ON_3dVector X;
    X.PerpendicularTo(N);
    X.Unitize();
    
    double t = fabs(ValueAt(P+X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;

    ON_3dVector Y = ON_CrossProduct(N,X);
    Y.Unitize();

    t = fabs(ValueAt(P+Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
  }

  return zero_tolerance;
}